

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extend-c-api.c
# Opt level: O0

int main(int argc,char **argv)

{
  qpdf_data p_Var1;
  uint uVar2;
  int iVar3;
  undefined8 uVar4;
  uint local_3c;
  char *pcStack_38;
  int npages;
  char *p;
  int errors;
  int warnings;
  qpdf_data qpdf;
  char *infile;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  qpdf = (qpdf_data)0x0;
  infile = (char *)argv;
  argv_local._0_4_ = argc;
  _errors = (qpdf_data)qpdf_init();
  p._4_4_ = 0;
  p._0_4_ = 0;
  pcStack_38 = (char *)0x0;
  pcStack_38 = strrchr(*(char **)infile,0x2f);
  if (pcStack_38 == (char *)0x0) {
    pcStack_38 = strrchr(*(char **)infile,0x5c);
    if (pcStack_38 == (char *)0x0) {
      whoami = *(char **)infile;
    }
    else {
      whoami = pcStack_38 + 1;
    }
  }
  else {
    whoami = pcStack_38 + 1;
  }
  if ((int)argv_local != 2) {
    usage();
  }
  qpdf = *(qpdf_data *)(infile + 8);
  uVar2 = qpdf_read(_errors,qpdf,0);
  if (((uVar2 & 2) == 0) && (uVar2 = num_pages(_errors,(int *)&local_3c), (uVar2 & 2) == 0)) {
    printf("num pages = %d\n",(ulong)local_3c);
  }
  iVar3 = qpdf_more_warnings(_errors);
  if (iVar3 != 0) {
    p._4_4_ = 1;
  }
  iVar3 = qpdf_has_error(_errors);
  p_Var1 = _errors;
  if (iVar3 != 0) {
    p._0_4_ = 1;
    uVar4 = qpdf_get_error(_errors);
    uVar4 = qpdf_get_error_full_text(p_Var1,uVar4);
    printf("error: %s\n",uVar4);
  }
  qpdf_cleanup(&errors);
  if ((int)p == 0) {
    if (p._4_4_ == 0) {
      argv_local._4_4_ = 0;
    }
    else {
      argv_local._4_4_ = 3;
    }
  }
  else {
    argv_local._4_4_ = 2;
  }
  return argv_local._4_4_;
}

Assistant:

int
main(int argc, char* argv[])
{
    char* infile = NULL;
    qpdf_data qpdf = qpdf_init();
    int warnings = 0;
    int errors = 0;
    char* p = NULL;

    if ((p = strrchr(argv[0], '/')) != NULL) {
        whoami = p + 1;
    } else if ((p = strrchr(argv[0], '\\')) != NULL) {
        whoami = p + 1;
    } else {
        whoami = argv[0];
    }

    if (argc != 2) {
        usage();
    }

    infile = argv[1];

    if ((qpdf_read(qpdf, infile, NULL) & QPDF_ERRORS) == 0) {
        int npages;
        if ((num_pages(qpdf, &npages) & QPDF_ERRORS) == 0) {
            printf("num pages = %d\n", npages);
        }
    }
    if (qpdf_more_warnings(qpdf)) {
        warnings = 1;
    }
    if (qpdf_has_error(qpdf)) {
        errors = 1;
        printf("error: %s\n", qpdf_get_error_full_text(qpdf, qpdf_get_error(qpdf)));
    }
    qpdf_cleanup(&qpdf);
    if (errors) {
        return 2;
    } else if (warnings) {
        return 3;
    }

    return 0;
}